

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_load(hsts *h,char *file)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_58;
  char *lineptr;
  dynbuf buf;
  FILE *fp;
  CURLcode result;
  char *file_local;
  hsts *h_local;
  
  (*Curl_cfree)(h->filename);
  pcVar2 = (*Curl_cstrdup)(file);
  h->filename = pcVar2;
  if (h->filename == (char *)0x0) {
    h_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    buf.toobig = (size_t)fopen64(file,"r");
    if ((FILE *)buf.toobig != (FILE *)0x0) {
      Curl_dyn_init((dynbuf *)&lineptr,0xfff);
      while (iVar1 = Curl_get_line((dynbuf *)&lineptr,(FILE *)buf.toobig), iVar1 != 0) {
        local_58 = Curl_dyn_ptr((dynbuf *)&lineptr);
        Curl_str_passblanks(&local_58);
        if ((*local_58 != '#') && (sVar3 = strlen(local_58), 1 < sVar3)) {
          hsts_add(h,local_58);
        }
      }
      Curl_dyn_free((dynbuf *)&lineptr);
      fclose((FILE *)buf.toobig);
    }
    h_local._4_4_ = CURLE_OK;
  }
  return h_local._4_4_;
}

Assistant:

static CURLcode hsts_load(struct hsts *h, const char *file)
{
  CURLcode result = CURLE_OK;
  FILE *fp;

  /* we need a private copy of the filename so that the hsts cache file
     name survives an easy handle reset */
  free(h->filename);
  h->filename = strdup(file);
  if(!h->filename)
    return CURLE_OUT_OF_MEMORY;

  fp = fopen(file, FOPEN_READTEXT);
  if(fp) {
    struct dynbuf buf;
    Curl_dyn_init(&buf, MAX_HSTS_LINE);
    while(Curl_get_line(&buf, fp)) {
      const char *lineptr = Curl_dyn_ptr(&buf);
      Curl_str_passblanks(&lineptr);

      /*
       * Skip empty or commented lines, since we know the line will have a
       * trailing newline from Curl_get_line we can treat length 1 as empty.
       */
      if((*lineptr == '#') || strlen(lineptr) <= 1)
        continue;

      hsts_add(h, lineptr);
    }
    Curl_dyn_free(&buf); /* free the line buffer */
    fclose(fp);
  }
  return result;
}